

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenStringEncodeSetArray(BinaryenExpressionRef expr,BinaryenExpressionRef arrayExpr)

{
  if (expr->_id != StringEncodeId) {
    __assert_fail("expression->is<StringEncode>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x12d5,
                  "void BinaryenStringEncodeSetArray(BinaryenExpressionRef, BinaryenExpressionRef)")
    ;
  }
  if (arrayExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = arrayExpr;
    return;
  }
  __assert_fail("arrayExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x12d6,
                "void BinaryenStringEncodeSetArray(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringEncodeSetArray(BinaryenExpressionRef expr,
                                  BinaryenExpressionRef arrayExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringEncode>());
  assert(arrayExpr);
  static_cast<StringEncode*>(expression)->array = (Expression*)arrayExpr;
}